

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall tinyusdz::Prim::set_primdata<tinyusdz::GeomMesh>(Prim *this,GeomMesh *prim)

{
  string local_110;
  Path local_f0;
  
  linb::any::operator=(&(this->_data).v_,prim);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  Path::Path(&local_f0,&(prim->super_GPrim).name,&local_110);
  Path::operator=(&this->_elementPath,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._element._M_dataplus._M_p != &local_f0._element.field_2) {
    operator_delete(local_f0._element._M_dataplus._M_p,
                    local_f0._element.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._variant_part_str._M_dataplus._M_p != &local_f0._variant_part_str.field_2) {
    operator_delete(local_f0._variant_part_str._M_dataplus._M_p,
                    local_f0._variant_part_str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._variant_selection_part._M_dataplus._M_p !=
      &local_f0._variant_selection_part.field_2) {
    operator_delete(local_f0._variant_selection_part._M_dataplus._M_p,
                    local_f0._variant_selection_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._variant_part._M_dataplus._M_p != &local_f0._variant_part.field_2) {
    operator_delete(local_f0._variant_part._M_dataplus._M_p,
                    local_f0._variant_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._prop_part._M_dataplus._M_p != &local_f0._prop_part.field_2) {
    operator_delete(local_f0._prop_part._M_dataplus._M_p,
                    local_f0._prop_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._prim_part._M_dataplus._M_p != &local_f0._prim_part.field_2) {
    operator_delete(local_f0._prim_part._M_dataplus._M_p,
                    local_f0._prim_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void set_primdata(const T &prim) {
    // Check if T is Prim class type.
    static_assert((value::TypeId::TYPE_ID_MODEL_BEGIN <=
                   value::TypeTraits<T>::type_id()) &&
                      (value::TypeId::TYPE_ID_MODEL_END >
                       value::TypeTraits<T>::type_id()),
                  "T is not a Prim class type");
    _data = prim;
    // Use prim.name for elementName
    _elementPath = Path(prim.name, "");
  }